

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_teamcity.hpp
# Opt level: O0

void __thiscall
Catch::TeamCityReporter::testCaseEnded(TeamCityReporter *this,TestCaseStats *testCaseStats)

{
  uint uVar1;
  ulong uVar2;
  ostream *poVar3;
  long in_RDI;
  string *in_stack_00000118;
  TestCaseStats *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [48];
  string local_30 [48];
  
  StreamingReporterBase<Catch::TeamCityReporter>::testCaseEnded
            ((StreamingReporterBase<Catch::TeamCityReporter> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8
            );
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<(*(ostream **)(in_RDI + 0x18),"##teamcity[testStdOut name=\'");
    escape(in_stack_00000118);
    poVar3 = std::operator<<(poVar3,local_30);
    poVar3 = std::operator<<(poVar3,"\' out=\'");
    escape(in_stack_00000118);
    poVar3 = std::operator<<(poVar3,local_60);
    std::operator<<(poVar3,"\']\n");
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_30);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<(*(ostream **)(in_RDI + 0x18),"##teamcity[testStdErr name=\'");
    escape(in_stack_00000118);
    poVar3 = std::operator<<(poVar3,local_80);
    poVar3 = std::operator<<(poVar3,"\' out=\'");
    escape(in_stack_00000118);
    poVar3 = std::operator<<(poVar3,local_a0);
    std::operator<<(poVar3,"\']\n");
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_80);
  }
  poVar3 = std::operator<<(*(ostream **)(in_RDI + 0x18),"##teamcity[testFinished name=\'");
  escape(in_stack_00000118);
  poVar3 = std::operator<<(poVar3,local_c0);
  poVar3 = std::operator<<(poVar3,"\' duration=\'");
  uVar1 = Timer::getElapsedMilliseconds((Timer *)0x1672a9);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar1);
  std::operator<<(poVar3,"\']\n");
  std::__cxx11::string::~string(local_c0);
  std::ostream::flush();
  return;
}

Assistant:

void testCaseEnded( TestCaseStats const& testCaseStats ) override {
            StreamingReporterBase::testCaseEnded( testCaseStats );
            if( !testCaseStats.stdOut.empty() )
                stream << "##teamcity[testStdOut name='"
                    << escape( testCaseStats.testInfo.name )
                    << "' out='" << escape( testCaseStats.stdOut ) << "']\n";
            if( !testCaseStats.stdErr.empty() )
                stream << "##teamcity[testStdErr name='"
                    << escape( testCaseStats.testInfo.name )
                    << "' out='" << escape( testCaseStats.stdErr ) << "']\n";
            stream << "##teamcity[testFinished name='"
                    << escape( testCaseStats.testInfo.name ) << "' duration='"
                    << m_testTimer.getElapsedMilliseconds() << "']\n";
            stream.flush();
        }